

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O0

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel
          (FloatSampleProvider *source,double sourceSampleRate,double targetSampleRate,
          Quality quality)

{
  LinearResampler *this;
  IIR2xInterpolator *this_00;
  ResamplerStage *pRVar1;
  InternalResamplerCascadeStage *pIVar2;
  IIR2xDecimator *pIVar3;
  double dVar4;
  double dVar5;
  ResamplerStage *iir2xDecimator;
  FloatSampleProvider *sincResamplerStage;
  ResamplerStage *sincResampler;
  uint maxUpsampleFactor;
  double sincOutSampleRate;
  double stopband;
  double passband;
  ResamplerStage *iir2xDecimator_1;
  ResamplerStage *sincResampler_1;
  double stopband_1;
  double passband_1;
  FloatSampleProvider *iir2xInterpolatorStage;
  ResamplerStage *iir2xInterpolator;
  double iirPassbandFraction;
  Quality iirQuality;
  Quality quality_local;
  double targetSampleRate_local;
  double sourceSampleRate_local;
  FloatSampleProvider *source_local;
  
  if ((sourceSampleRate != targetSampleRate) ||
     (source_local = source, NAN(sourceSampleRate) || NAN(targetSampleRate))) {
    if (quality == FASTEST) {
      source_local = (FloatSampleProvider *)operator_new(0x8028);
      this = (LinearResampler *)operator_new(0x20);
      LinearResampler::LinearResampler(this,sourceSampleRate,targetSampleRate);
      InternalResamplerCascadeStage::InternalResamplerCascadeStage
                ((InternalResamplerCascadeStage *)source_local,source,(ResamplerStage *)this);
    }
    else {
      dVar4 = IIRResampler::getPassbandFractionForQuality(quality);
      if (targetSampleRate <= sourceSampleRate) {
        if ((sourceSampleRate != targetSampleRate * 2.0) ||
           (NAN(sourceSampleRate) || NAN(targetSampleRate * 2.0))) {
          dVar5 = ceil(((targetSampleRate + targetSampleRate) * 256.0) / sourceSampleRate);
          pRVar1 = SincResampler::createSincResampler
                             (sourceSampleRate,targetSampleRate + targetSampleRate,
                              targetSampleRate * 0.5 * dVar4,targetSampleRate * 1.5,106.0,
                              (uint)(long)dVar5);
          pIVar2 = (InternalResamplerCascadeStage *)operator_new(0x8028);
          InternalResamplerCascadeStage::InternalResamplerCascadeStage(pIVar2,source,pRVar1);
          pIVar3 = (IIR2xDecimator *)operator_new(0x28);
          IIR2xDecimator::IIR2xDecimator(pIVar3,quality);
          source_local = (FloatSampleProvider *)operator_new(0x8028);
          InternalResamplerCascadeStage::InternalResamplerCascadeStage
                    ((InternalResamplerCascadeStage *)source_local,(FloatSampleProvider *)pIVar2,
                     (ResamplerStage *)pIVar3);
        }
        else {
          pIVar3 = (IIR2xDecimator *)operator_new(0x28);
          IIR2xDecimator::IIR2xDecimator(pIVar3,quality);
          source_local = (FloatSampleProvider *)operator_new(0x8028);
          InternalResamplerCascadeStage::InternalResamplerCascadeStage
                    ((InternalResamplerCascadeStage *)source_local,source,(ResamplerStage *)pIVar3);
        }
      }
      else {
        this_00 = (IIR2xInterpolator *)operator_new(0x38);
        IIR2xInterpolator::IIR2xInterpolator(this_00,quality);
        source_local = (FloatSampleProvider *)operator_new(0x8028);
        InternalResamplerCascadeStage::InternalResamplerCascadeStage
                  ((InternalResamplerCascadeStage *)source_local,source,(ResamplerStage *)this_00);
        if ((sourceSampleRate * 2.0 != targetSampleRate) ||
           (NAN(sourceSampleRate * 2.0) || NAN(targetSampleRate))) {
          pRVar1 = SincResampler::createSincResampler
                             (sourceSampleRate + sourceSampleRate,targetSampleRate,
                              sourceSampleRate * 0.5 * dVar4,sourceSampleRate * 1.5,106.0,0x80);
          pIVar2 = (InternalResamplerCascadeStage *)operator_new(0x8028);
          InternalResamplerCascadeStage::InternalResamplerCascadeStage(pIVar2,source_local,pRVar1);
          source_local = (FloatSampleProvider *)pIVar2;
        }
      }
    }
  }
  return source_local;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, double sourceSampleRate, double targetSampleRate, Quality quality) {
	if (sourceSampleRate == targetSampleRate) {
		return source;
	}
	if (quality == FASTEST) {
		return *new InternalResamplerCascadeStage(source, *new LinearResampler(sourceSampleRate, targetSampleRate));
	}
	const IIRResampler::Quality iirQuality = static_cast<IIRResampler::Quality>(quality);
	const double iirPassbandFraction = IIRResampler::getPassbandFractionForQuality(iirQuality);
	if (sourceSampleRate < targetSampleRate) {
		ResamplerStage *iir2xInterpolator = new IIR2xInterpolator(iirQuality);
		FloatSampleProvider &iir2xInterpolatorStage = *new InternalResamplerCascadeStage(source, *iir2xInterpolator);

		if (2.0 * sourceSampleRate == targetSampleRate) {
			return iir2xInterpolatorStage;
		}

		double passband = 0.5 * sourceSampleRate * iirPassbandFraction;
		double stopband = 1.5 * sourceSampleRate;
		ResamplerStage *sincResampler = SincResampler::createSincResampler(2.0 * sourceSampleRate, targetSampleRate, passband, stopband, DEFAULT_DB_SNR, DEFAULT_WINDOWED_SINC_MAX_UPSAMPLE_FACTOR);
		return *new InternalResamplerCascadeStage(iir2xInterpolatorStage, *sincResampler);
	}

	if (sourceSampleRate == 2.0 * targetSampleRate) {
		ResamplerStage *iir2xDecimator = new IIR2xDecimator(iirQuality);
		return *new InternalResamplerCascadeStage(source, *iir2xDecimator);
	}

	double passband = 0.5 * targetSampleRate * iirPassbandFraction;
	double stopband = 1.5 * targetSampleRate;
	double sincOutSampleRate = 2.0 * targetSampleRate;
	const unsigned int maxUpsampleFactor = static_cast<unsigned int>(ceil(DEFAULT_WINDOWED_SINC_MAX_DOWNSAMPLE_FACTOR * sincOutSampleRate / sourceSampleRate));
	ResamplerStage *sincResampler = SincResampler::createSincResampler(sourceSampleRate, sincOutSampleRate, passband, stopband, DEFAULT_DB_SNR, maxUpsampleFactor);
	FloatSampleProvider &sincResamplerStage = *new InternalResamplerCascadeStage(source, *sincResampler);

	ResamplerStage *iir2xDecimator = new IIR2xDecimator(iirQuality);
	return *new InternalResamplerCascadeStage(sincResamplerStage, *iir2xDecimator);
}